

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

void __thiscall QPDF::closeInputSource(QPDF *this)

{
  InvalidInputSource *this_00;
  pointer pMVar1;
  shared_ptr<InputSource> local_20;
  QPDF *local_10;
  QPDF *this_local;
  
  local_10 = this;
  this_00 = (InvalidInputSource *)operator_new(0xa8);
  memset(this_00,0,0xa8);
  anon_unknown.dwarf_11b796::InvalidInputSource::InvalidInputSource(this_00);
  std::shared_ptr<InputSource>::shared_ptr<(anonymous_namespace)::InvalidInputSource,void>
            (&local_20,this_00);
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::shared_ptr<InputSource>::operator=(&pMVar1->file,&local_20);
  std::shared_ptr<InputSource>::~shared_ptr(&local_20);
  return;
}

Assistant:

void
QPDF::closeInputSource()
{
    m->file = std::shared_ptr<InputSource>(new InvalidInputSource());
}